

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O3

void cf_ssl_scache_clear_peer(Curl_ssl_scache_peer *peer)

{
  Curl_llist_destroy(&peer->sessions,(void *)0x0);
  if (peer->sobj != (void *)0x0) {
    if (peer->sobj_free != (_func_void_void_ptr *)0x0) {
      (*peer->sobj_free)(peer->sobj);
    }
    peer->sobj = (void *)0x0;
  }
  peer->sobj_free = (_func_void_void_ptr *)0x0;
  (*Curl_cfree)(peer->clientcert);
  peer->clientcert = (char *)0x0;
  (*Curl_cfree)(peer->srp_username);
  peer->srp_username = (char *)0x0;
  (*Curl_cfree)(peer->srp_password);
  peer->srp_password = (char *)0x0;
  (*Curl_cfree)(peer->ssl_peer_key);
  peer->ssl_peer_key = (char *)0x0;
  peer->age = 0;
  peer->field_0xa0 = peer->field_0xa0 & 0xfe;
  return;
}

Assistant:

static void cf_ssl_scache_clear_peer(struct Curl_ssl_scache_peer *peer)
{
  Curl_llist_destroy(&peer->sessions, NULL);
  if(peer->sobj) {
    DEBUGASSERT(peer->sobj_free);
    if(peer->sobj_free)
      peer->sobj_free(peer->sobj);
    peer->sobj = NULL;
  }
  peer->sobj_free = NULL;
  Curl_safefree(peer->clientcert);
#ifdef USE_TLS_SRP
  Curl_safefree(peer->srp_username);
  Curl_safefree(peer->srp_password);
#endif
  Curl_safefree(peer->ssl_peer_key);
  peer->age = 0;
  peer->hmac_set = FALSE;
}